

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

bool __thiscall KDReports::Report::isTableBreakingEnabled(Report *this)

{
  int iVar1;
  undefined1 local_11;
  Report *this_local;
  
  iVar1 = maximumNumberOfPagesForHorizontalScaling(this);
  local_11 = true;
  if (iVar1 == 1) {
    iVar1 = maximumNumberOfPagesForVerticalScaling(this);
    local_11 = 0 < iVar1;
  }
  return local_11;
}

Assistant:

bool KDReports::Report::isTableBreakingEnabled() const
{
    return maximumNumberOfPagesForHorizontalScaling() != 1 || maximumNumberOfPagesForVerticalScaling() > 0;
}